

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tournament-mode-driver.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  
  std::operator<<((ostream *)&std::cout,"\x1b[34m");
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "--------------------------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "------------ Running the game start phase --------------");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "--------------------------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"\x1b[30m");
  std::operator<<((ostream *)&std::cout,"\n");
  GameLoop::start();
  return 0;
}

Assistant:

int main() {

    std::cout << "\033[34m";
    std::cout << "--------------------------------------------------------" << std::endl;
    std::cout << "------------ Running the game start phase --------------" << std::endl;
    std::cout << "--------------------------------------------------------" << std::endl;
    std::cout << "\033[30m";

    cout << "\n";

    GameLoop::start();

    return 0;
}